

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastDecimalToFloatingPoint<short,double>(short input,double *result,uint8_t scale)

{
  bool bVar1;
  byte in_DL;
  double *in_RSI;
  int16_t in_DI;
  double dVar2;
  double dVar3;
  short mod;
  short div;
  short power_of_ten;
  undefined1 in_stack_00000016;
  short local_18 [3];
  byte local_11;
  double *local_10;
  short local_4;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  local_4 = in_DI;
  bVar1 = IsRepresentableExactly<short,double>(in_DI,0.0);
  if ((bVar1) || (local_11 == 0)) {
    dVar2 = Cast::Operation<short,double>(_in_stack_00000016);
    *local_10 = dVar2 / *(double *)(NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)local_11 * 8);
  }
  else {
    local_18[2] = GetPowerOfTen<short>(local_4,local_11);
    local_18[1] = 0;
    local_18[0] = 0;
    GetDivMod<short>(local_4,local_18[2],local_18 + 1,local_18);
    dVar2 = Cast::Operation<short,double>(_in_stack_00000016);
    dVar3 = Cast::Operation<short,double>(_in_stack_00000016);
    *local_10 = dVar2 + dVar3 / *(double *)
                                 (NumericHelper::DOUBLE_POWERS_OF_TEN + (ulong)local_11 * 8);
  }
  return true;
}

Assistant:

bool TryCastDecimalToFloatingPoint(SRC input, DST &result, uint8_t scale) {
	if (IsRepresentableExactly<SRC, DST>(input, DST(0.0)) || scale == 0) {
		// Fast path, integer is representable exaclty as a float/double
		result = Cast::Operation<SRC, DST>(input) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
		return true;
	}
	auto power_of_ten = GetPowerOfTen(input, scale);

	SRC div = 0;
	SRC mod = 0;
	GetDivMod(input, power_of_ten, div, mod);

	result = Cast::Operation<SRC, DST>(div) +
	         Cast::Operation<SRC, DST>(mod) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
	return true;
}